

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  secp256k1_modinv32_signed30 *b;
  uint uVar13;
  int extraout_EDX;
  uint uVar14;
  int extraout_EDX_00;
  int extraout_EDX_01;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar15;
  long lVar16;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  uint uVar17;
  secp256k1_modinv32_signed30 *unaff_RBX;
  int *piVar18;
  secp256k1_modinv32_signed30 *psVar19;
  secp256k1_fe *psVar20;
  uint uVar21;
  ulong unaff_RBP;
  long lVar22;
  secp256k1_fe *psVar23;
  secp256k1_fe *psVar24;
  secp256k1_fe *r;
  secp256k1_modinv32_signed30 *psVar25;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar26;
  ulong uVar27;
  secp256k1_fe *r_00;
  uchar *__s;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int *piVar33;
  uint uVar34;
  secp256k1_modinv32_modinfo *unaff_R12;
  secp256k1_modinv32_modinfo *psVar35;
  secp256k1_modinv32_signed30 *psVar36;
  code *pcVar37;
  ulong uVar38;
  secp256k1_modinv32_signed30 *psVar39;
  size_t count;
  secp256k1_modinv32_signed30 *unaff_R14;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  code *pcVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint32_t c1;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_signed30 e;
  ulong uStack_1478;
  secp256k1_fe *psStack_1470;
  uchar auStack_1468 [4232];
  secp256k1_fe *psStack_3e0;
  code *pcStack_3d8;
  undefined8 uStack_3d0;
  secp256k1_fe *psStack_3c8;
  code *pcStack_3c0;
  code *pcStack_3b8;
  undefined1 auStack_3b0 [36];
  int iStack_38c;
  int iStack_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  int iStack_378;
  int iStack_374;
  undefined1 auStack_370 [48];
  code *pcStack_340;
  secp256k1_fe sStack_338;
  secp256k1_fe sStack_308;
  secp256k1_fe sStack_2d8;
  ulong uStack_2a0;
  ulong uStack_298;
  ulong uStack_290;
  secp256k1_modinv32_signed30 *psStack_288;
  ulong uStack_280;
  code *pcStack_278;
  uint uStack_270;
  uint uStack_26c;
  uint uStack_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  secp256k1_modinv32_signed30 *psStack_258;
  uint uStack_24c;
  uint uStack_248;
  uint uStack_244;
  uint uStack_240;
  int32_t iStack_23c;
  secp256k1_modinv32_signed30 *psStack_238;
  secp256k1_modinv32_signed30 *psStack_230;
  secp256k1_modinv32_signed30 *psStack_228;
  secp256k1_modinv32_signed30 *psStack_220;
  secp256k1_modinv32_signed30 *psStack_218;
  code *pcStack_210;
  long lStack_200;
  long lStack_1f8;
  int *piStack_1f0;
  secp256k1_modinv32_modinfo *psStack_1e8;
  ulong uStack_1e0;
  ulong uStack_1d0;
  code *pcStack_1c8;
  secp256k1_modinv32_signed30 *psStack_1c0;
  int *piStack_1b0;
  secp256k1_modinv32_modinfo *psStack_1a8;
  ulong uStack_1a0;
  ulong uStack_190;
  code *pcStack_188;
  secp256k1_modinv32_signed30 sStack_180;
  secp256k1_modinv32_signed30 sStack_15c;
  secp256k1_modinv32_signed30 *psStack_138;
  secp256k1_modinv32_signed30 *psStack_130;
  secp256k1_modinv32_modinfo *local_120;
  uint local_114;
  uint local_110;
  uint local_10c;
  secp256k1_modinv32_signed30 local_108;
  secp256k1_modinv32_trans2x2 local_d8;
  secp256k1_modinv32_signed30 local_c8;
  secp256k1_modinv32_signed30 *local_98;
  long local_90;
  secp256k1_modinv32_signed30 local_88;
  secp256k1_modinv32_signed30 local_58;
  
  uVar9 = 0;
  local_88.v[8] = 0;
  local_88.v[4] = 0;
  local_88.v[5] = 0;
  local_88.v[6] = 0;
  local_88.v[7] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[8] = 0;
  local_58.v[4] = 0;
  local_58.v[5] = 0;
  local_58.v[6] = 0;
  local_58.v[7] = 0;
  local_58.v[0] = 1;
  local_58.v[1] = 0;
  local_108.v[8] = (modinfo->modulus).v[8];
  local_108.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_108.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_108.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_108.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_c8.v[8] = x->v[8];
  local_c8.v._0_8_ = *(undefined8 *)x->v;
  local_c8.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_c8.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_c8.v._24_8_ = *(undefined8 *)(x->v + 6);
  uVar42 = 0xffffffff;
  local_120 = modinfo;
  local_98 = x;
  do {
    local_90 = (long)local_108.v[0];
    uVar38 = (ulong)local_c8.v[0];
    uVar11 = 0;
    psVar25 = (secp256k1_modinv32_signed30 *)0x1;
    uVar14 = 0;
    uVar13 = 0;
    uVar29 = 1;
    uVar31 = local_c8.v[0];
    uVar32 = local_108.v[0];
    do {
      uVar5 = local_108.v[0];
      local_114 = uVar9;
      if ((uVar32 & 1) == 0) {
        psStack_130 = (secp256k1_modinv32_signed30 *)0x14b843;
        secp256k1_modinv32_cold_17();
LAB_0014b843:
        psStack_130 = (secp256k1_modinv32_signed30 *)0x14b848;
        secp256k1_modinv32_cold_1();
LAB_0014b848:
        psStack_130 = (secp256k1_modinv32_signed30 *)0x14b84d;
        secp256k1_modinv32_cold_2();
        psVar35 = unaff_R12;
LAB_0014b84d:
        psStack_130 = (secp256k1_modinv32_signed30 *)0x14b852;
        secp256k1_modinv32_cold_16();
        goto LAB_0014b852;
      }
      uVar30 = (uint)psVar25;
      uVar21 = uVar14 * local_c8.v[0] + uVar30 * local_108.v[0];
      unaff_RBP = (ulong)uVar21;
      uVar17 = uVar32 << ((byte)uVar11 & 0x1f);
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar17;
      if (uVar21 != uVar17) goto LAB_0014b843;
      uVar21 = uVar29 * local_c8.v[0] + uVar13 * local_108.v[0];
      unaff_RBP = (ulong)uVar21;
      uVar17 = uVar31 << ((byte)uVar11 & 0x1f);
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar17;
      if (uVar21 != uVar17) goto LAB_0014b848;
      local_10c = (int)(uint)uVar42 >> 0x1f;
      unaff_RBP = (ulong)local_10c;
      local_110 = uVar31 & 1;
      uVar17 = -local_110;
      unaff_R14 = (secp256k1_modinv32_signed30 *)(ulong)uVar17;
      uVar21 = local_10c & uVar17;
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar21;
      uVar40 = (uint)uVar42 ^ uVar21;
      uVar42 = (ulong)uVar40;
      psVar35 = (secp256k1_modinv32_modinfo *)(ulong)(uVar40 - 0x25b);
      if (uVar40 - 0x25b < 0xfffffb4d) goto LAB_0014b84d;
      uVar42 = (ulong)(uVar40 - 1);
      uVar29 = uVar29 + ((local_10c ^ uVar14) - local_10c & uVar17);
      uVar14 = (uVar14 + (uVar29 & uVar21)) * 2;
      uVar13 = uVar13 + ((local_10c ^ uVar30) - local_10c & uVar17);
      uVar30 = (uVar30 + (uVar13 & uVar21)) * 2;
      psVar25 = (secp256k1_modinv32_signed30 *)(ulong)uVar30;
      uVar17 = ((local_10c ^ uVar32) - local_10c & uVar17) + uVar31;
      uVar31 = uVar17 >> 1;
      uVar17 = uVar17 & uVar21;
      unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
      uVar32 = uVar32 + uVar17;
      uVar17 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar17;
    } while (uVar17 != 0x1e);
    unaff_RBX = (secp256k1_modinv32_signed30 *)(long)(int)uVar30;
    unaff_R14 = (secp256k1_modinv32_signed30 *)(long)(int)uVar29;
    unaff_RBP = (ulong)(int)uVar14;
    psVar35 = (secp256k1_modinv32_modinfo *)(long)(int)uVar13;
    uVar11 = (long)unaff_RBX * (long)unaff_R14 - unaff_RBP * (long)psVar35;
    local_d8.u = uVar30;
    local_d8.v = uVar14;
    local_d8.q = uVar13;
    local_d8.r = uVar29;
    if (uVar11 != 0x40000000) {
LAB_0014b852:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b857;
      secp256k1_modinv32_cold_3();
LAB_0014b857:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b85c;
      secp256k1_modinv32_cold_15();
LAB_0014b85c:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b861;
      secp256k1_modinv32_cold_14();
LAB_0014b861:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b866;
      secp256k1_modinv32_cold_13();
LAB_0014b866:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b86b;
      secp256k1_modinv32_cold_12();
LAB_0014b86b:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b870;
      secp256k1_modinv32_cold_4();
LAB_0014b870:
      unaff_R12 = psVar35;
      uVar9 = (uint)uVar11;
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b875;
      secp256k1_modinv32_cold_5();
LAB_0014b875:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b87a;
      secp256k1_modinv32_cold_11();
LAB_0014b87a:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b87f;
      secp256k1_modinv32_cold_10();
LAB_0014b87f:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b884;
      secp256k1_modinv32_cold_9();
LAB_0014b884:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b889;
      secp256k1_modinv32_cold_8();
      goto LAB_0014b889;
    }
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b556;
    secp256k1_modinv32_update_de_30(&local_88,&local_58,&local_d8,local_120);
    psVar25 = &local_108;
    uVar5 = 9;
    uVar11 = 0xffffffff;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b56f;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,&local_120->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b857;
    psVar25 = &local_108;
    uVar5 = 9;
    uVar11 = 1;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b590;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,&local_120->modulus,1);
    if (0 < iVar4) goto LAB_0014b85c;
    psVar25 = &local_c8;
    uVar5 = 9;
    uVar11 = 0xffffffff;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b5b1;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,&local_120->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b861;
    psVar25 = &local_c8;
    uVar5 = 9;
    uVar11 = 1;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b5d2;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,&local_120->modulus,1);
    unaff_R12 = local_120;
    if (-1 < iVar4) goto LAB_0014b866;
    uVar11 = (long)unaff_RBX * local_90;
    uVar7 = unaff_RBP * uVar38 + uVar11;
    if ((uVar7 & 0x3ffffffe) != 0) goto LAB_0014b86b;
    uVar38 = uVar38 * (long)unaff_R14 + local_90 * (long)psVar35;
    if ((uVar38 & 0x3fffffff) != 0) goto LAB_0014b870;
    uVar38 = (long)uVar38 >> 0x1e;
    lVar8 = (long)uVar7 >> 0x1e;
    lVar12 = 1;
    do {
      lVar8 = (long)local_c8.v[lVar12] * unaff_RBP +
              (long)local_108.v[lVar12] * (long)unaff_RBX + lVar8;
      lVar22 = (long)local_c8.v[lVar12] * (long)unaff_R14 +
               (long)local_108.v[lVar12] * (long)psVar35 + uVar38;
      (&local_10c)[lVar12] = (uint)lVar8 & 0x3fffffff;
      local_c8.v[lVar12 + -1] = (uint)lVar22 & 0x3fffffff;
      lVar12 = lVar12 + 1;
      uVar38 = lVar22 >> 0x1e;
      lVar8 = lVar8 >> 0x1e;
    } while (lVar12 != 9);
    local_108.v[8] = (int32_t)lVar8;
    local_c8.v[8] = (int32_t)uVar38;
    unaff_RBX = &local_108;
    uVar5 = 9;
    uVar9 = 0xffffffff;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b6a6;
    psVar25 = unaff_RBX;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_120->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b875;
    uVar5 = 9;
    uVar9 = 1;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b6c3;
    psVar25 = unaff_RBX;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&unaff_R12->modulus,1);
    if (0 < iVar4) goto LAB_0014b87a;
    unaff_RBX = &local_c8;
    uVar5 = 9;
    uVar9 = 0xffffffff;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b6e5;
    psVar25 = unaff_RBX;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&unaff_R12->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b87f;
    uVar5 = 9;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b702;
    psVar25 = unaff_RBX;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&unaff_R12->modulus,1);
    uVar9 = local_114;
    if (-1 < iVar4) goto LAB_0014b884;
    uVar9 = local_114 + 1;
  } while (uVar9 != 0x14);
  psVar25 = &local_c8;
  uVar5 = 9;
  uVar9 = 0;
  psStack_130 = (secp256k1_modinv32_signed30 *)0x14b731;
  iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar4 == 0) {
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b754;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&local_108,9,&SECP256K1_SIGNED30_ONE,-1);
    unaff_R14 = local_98;
    if (iVar4 == 0) {
LAB_0014b7fe:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b815;
      secp256k1_modinv32_normalize_30(&local_88,local_108.v[8],unaff_R12);
      unaff_R14->v[8] = local_88.v[8];
      *(undefined8 *)(unaff_R14->v + 4) = local_88.v._16_8_;
      *(undefined8 *)(unaff_R14->v + 6) = local_88.v._24_8_;
      *(undefined8 *)unaff_R14->v = local_88.v._0_8_;
      *(undefined8 *)(unaff_R14->v + 2) = local_88.v._8_8_;
      return;
    }
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b77f;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&local_108,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar4 == 0) goto LAB_0014b7fe;
    uVar5 = 9;
    uVar9 = 0;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b799;
    psVar25 = unaff_R14;
    iVar4 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar4 == 0) {
      psVar25 = &local_88;
      uVar5 = 9;
      uVar9 = 0;
      psStack_130 = (secp256k1_modinv32_signed30 *)0x14b7bc;
      iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar4 == 0) {
        psStack_130 = (secp256k1_modinv32_signed30 *)0x14b7db;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&local_108,9,&unaff_R12->modulus,1);
        if (iVar4 == 0) goto LAB_0014b7fe;
        psVar25 = &local_108;
        uVar5 = 9;
        uVar9 = 0xffffffff;
        psStack_130 = (secp256k1_modinv32_signed30 *)0x14b7f6;
        iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,&unaff_R12->modulus,-1);
        if (iVar4 == 0) goto LAB_0014b7fe;
      }
    }
  }
  else {
LAB_0014b889:
    psStack_130 = (secp256k1_modinv32_signed30 *)0x14b88e;
    secp256k1_modinv32_cold_6();
  }
  psStack_130 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_180;
  piVar18 = (int *)(ulong)uVar9;
  pcStack_188 = (code *)0x14b8b3;
  psStack_138 = unaff_RBX;
  psStack_130 = unaff_R14;
  secp256k1_modinv32_mul_30(&sStack_15c,psVar25,uVar5,1);
  pcStack_188 = (code *)0x14b8c5;
  piVar33 = piVar18;
  psVar25 = a_00;
  secp256k1_modinv32_mul_30(&sStack_180,a_00,9,uVar9);
  lVar8 = 0;
  while ((uint)sStack_15c.v[lVar8] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_180.v[lVar8]) goto LAB_0014b917;
    lVar8 = lVar8 + 1;
    if (lVar8 == 8) {
      uVar9 = 8;
      while( true ) {
        if (sStack_15c.v[uVar9] < sStack_180.v[uVar9]) {
          return;
        }
        if (sStack_180.v[uVar9] < sStack_15c.v[uVar9]) break;
        bVar44 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar44) {
          return;
        }
      }
      return;
    }
  }
  pcStack_188 = (code *)0x14b917;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014b917:
  pcStack_188 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar4 = (int)a_01;
  piStack_1b0 = piVar18;
  psStack_1a8 = unaff_R12;
  uStack_1a0 = uVar38;
  uStack_190 = uVar42;
  pcStack_188 = (code *)unaff_RBP;
  if (iVar4 < 1) {
    psStack_1c0 = (secp256k1_modinv32_signed30 *)0x14ba0a;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014ba0a:
    iVar10 = (int)piVar33;
    psStack_1c0 = (secp256k1_modinv32_signed30 *)0x14ba0f;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar1 = piVar33[1];
    iVar2 = *piVar33;
    piVar18 = (int *)(long)psVar25->v[0];
    uVar11 = (long)*extraout_RDX * (long)iVar1 + (long)piVar18 * (long)iVar2;
    if ((uVar11 & 0x3fffffff) != 0) goto LAB_0014ba0a;
    iVar3 = piVar33[3];
    iVar10 = piVar33[2];
    piVar18 = (int *)((long)piVar18 * (long)iVar10);
    piVar33 = (int *)((long)*extraout_RDX * (long)iVar3 + (long)piVar18);
    if (((ulong)piVar33 & 0x3fffffff) == 0) {
      lVar12 = (long)piVar33 >> 0x1e;
      lVar8 = (long)uVar11 >> 0x1e;
      if (iVar4 != 1) {
        uVar42 = 1;
        do {
          lVar8 = (long)extraout_RDX[uVar42] * (long)iVar1 +
                  (long)psVar25->v[uVar42] * (long)iVar2 + lVar8;
          lVar12 = (long)extraout_RDX[uVar42] * (long)iVar3 +
                   (long)psVar25->v[uVar42] * (long)iVar10 + lVar12;
          psVar25->v[uVar42 - 1] = (uint)lVar8 & 0x3fffffff;
          extraout_RDX[uVar42 - 1] = (uint)lVar12 & 0x3fffffff;
          uVar42 = uVar42 + 1;
          lVar12 = lVar12 >> 0x1e;
          lVar8 = lVar8 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar42);
      }
      psVar25->v[(long)iVar4 + -1] = (int32_t)lVar8;
      extraout_RDX[(long)iVar4 + -1] = (int)lVar12;
      return;
    }
  }
  psStack_1c0 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar8 = 0;
  psStack_1c0 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar8 < extraout_EDX) {
      psStack_1c0 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_1c0->v + (long)psVar25->v[lVar8] * (long)iVar10);
    }
    a_01->v[lVar8] = (uint)psStack_1c0 & 0x3fffffff;
    psStack_1c0 = (secp256k1_modinv32_signed30 *)((long)psStack_1c0 >> 0x1e);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  if (8 < extraout_EDX) {
    psStack_1c0 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_1c0->v + (long)psVar25->v[8] * (long)iVar10);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_1c0;
  if (b == psStack_1c0) {
    a_01->v[8] = (int)psStack_1c0;
    return;
  }
  pcStack_1c8 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar9 = *extraout_RDX_00;
  psVar39 = (secp256k1_modinv32_signed30 *)(long)(int)uVar9;
  uVar14 = extraout_RDX_00[1];
  lVar8 = (long)(int)uVar14;
  uVar31 = extraout_RDX_00[2];
  psVar19 = (secp256k1_modinv32_signed30 *)(long)(int)uVar31;
  lStack_200 = (long)(int)extraout_RDX_00[3];
  psVar23 = (secp256k1_fe *)0x9;
  pcStack_210 = (code *)0x14baa9;
  a_02 = a_01;
  piStack_1f0 = piVar18;
  psStack_1e8 = unaff_R12;
  uStack_1e0 = uVar38;
  uStack_1d0 = uVar42;
  pcStack_1c8 = (code *)unaff_RBP;
  iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar4 < 1) {
    pcStack_210 = (code *)0x14bd11;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bd11:
    pcStack_210 = (code *)0x14bd16;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bd16:
    pcStack_210 = (code *)0x14bd1b;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bd1b:
    pcStack_210 = (code *)0x14bd20;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bd20:
    pcStack_210 = (code *)0x14bd25;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bd25:
    pcStack_210 = (code *)0x14bd2a;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bd2a:
    pcStack_210 = (code *)0x14bd2f;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bd2f:
    pcStack_210 = (code *)0x14bd34;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar36 = b;
LAB_0014bd34:
    pcStack_210 = (code *)0x14bd39;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bd39:
    pcStack_210 = (code *)0x14bd3e;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bd3e:
    pcStack_210 = (code *)0x14bd43;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x14bac6;
    a_02 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar4) goto LAB_0014bd11;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x14bae3;
    a_02 = psVar25;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,b,-2);
    if (iVar4 < 1) goto LAB_0014bd16;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x14bb00;
    a_02 = psVar25;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,b,1);
    if (-1 < iVar4) goto LAB_0014bd1b;
    psVar36 = (secp256k1_modinv32_signed30 *)-(long)psVar39;
    if (0 < (long)psVar39) {
      psVar36 = psVar39;
    }
    lVar12 = -lVar8;
    if (lVar8 < 1) {
      lVar12 = lVar8;
    }
    if (lVar12 + 0x40000000 < (long)psVar36) goto LAB_0014bd20;
    psVar36 = (secp256k1_modinv32_signed30 *)-(long)psVar19;
    if (0 < (long)psVar19) {
      psVar36 = psVar19;
    }
    lVar12 = -lStack_200;
    if (lStack_200 < 1) {
      lVar12 = lStack_200;
    }
    if (lVar12 + 0x40000000 < (long)psVar36) goto LAB_0014bd25;
    uVar13 = a_01->v[8] >> 0x1f;
    uVar32 = psVar25->v[8] >> 0x1f;
    psVar23 = (secp256k1_fe *)(ulong)uVar32;
    iVar4 = (uVar32 & uVar14) + (uVar13 & uVar9);
    a_02 = (secp256k1_modinv32_signed30 *)(psVar25->v[0] * lVar8 + (long)a_01->v[0] * (long)psVar39)
    ;
    lVar12 = (long)(int)(iVar4 - ((int)a_02 * b[1].v[0] + iVar4 & 0x3fffffffU));
    piVar15 = (int32_t *)((long)a_02->v + lVar12 * b->v[0]);
    if (((ulong)piVar15 & 0x3fffffff) != 0) goto LAB_0014bd2a;
    lStack_1f8 = lVar12;
    iVar4 = (uVar32 & (uint)lStack_200) + (uVar13 & uVar31);
    lVar22 = psVar25->v[0] * lStack_200 + (long)a_01->v[0] * (long)psVar19;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar9 = iVar4 - (b[1].v[0] * (int)lVar22 + iVar4 & 0x3fffffffU);
    psVar23 = (secp256k1_fe *)(ulong)uVar9;
    uVar42 = (long)b->v[0] * (long)(int)uVar9 + lVar22;
    if ((uVar42 & 0x3fffffff) != 0) goto LAB_0014bd2f;
    lVar22 = (long)uVar42 >> 0x1e;
    lVar16 = (long)piVar15 >> 0x1e;
    lVar26 = 1;
    do {
      lVar16 = b->v[lVar26] * lVar12 + psVar25->v[lVar26] * lVar8 +
               (long)a_01->v[lVar26] * (long)psVar39 + lVar16;
      psVar36 = (secp256k1_modinv32_signed30 *)(psVar25->v[lVar26] * lStack_200);
      lVar22 = (long)psVar36->v +
               (long)a_01->v[lVar26] * (long)psVar19 + lVar22 +
               (long)b->v[lVar26] * (long)(int)uVar9;
      a_01->v[lVar26 + -1] = (uint)lVar16 & 0x3fffffff;
      psVar25->v[lVar26 + -1] = (uint)lVar22 & 0x3fffffff;
      lVar26 = lVar26 + 1;
      lVar22 = lVar22 >> 0x1e;
      lVar16 = lVar16 >> 0x1e;
    } while (lVar26 != 9);
    a_01->v[8] = (int32_t)lVar16;
    psVar25->v[8] = (int32_t)lVar22;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x14bcaa;
    a_02 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar19 = psVar25;
    psVar39 = b;
    if (iVar4 < 1) goto LAB_0014bd34;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x14bcc7;
    a_02 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar4) goto LAB_0014bd39;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x14bce0;
    a_02 = psVar25;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,b,-2);
    if (iVar4 < 1) goto LAB_0014bd3e;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x14bcf9;
    a_02 = psVar25;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar25,9,b,1);
    if (iVar4 < 0) {
      return;
    }
  }
  pcStack_210 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_210 = (code *)lVar8;
  psStack_218 = a_01;
  psStack_220 = psVar25;
  psStack_228 = psVar39;
  psStack_230 = psVar36;
  psStack_238 = psVar19;
  uVar9 = a_02->v[0];
  uVar27 = (ulong)uVar9;
  uVar14 = a_02->v[3];
  uVar7 = (ulong)uVar14;
  uVar31 = a_02->v[4];
  uVar11 = (ulong)uVar31;
  uVar32 = a_02->v[5];
  uVar38 = (ulong)uVar32;
  psVar25 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar13 = a_02->v[7];
  uVar42 = (ulong)uVar13;
  iStack_23c = a_02->v[8];
  lVar8 = 0;
  do {
    if (a_02->v[lVar8] < -0x3fffffff) {
      pcStack_278 = (code *)0x14c091;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014c091:
      pcStack_278 = (code *)0x14c096;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014c096;
    }
    if (0x3fffffff < a_02->v[lVar8]) goto LAB_0014c091;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 9);
  uStack_25c = (uint)psVar23;
  psVar23 = (secp256k1_fe *)0x9;
  pcStack_278 = (code *)0x14bdce;
  psVar25 = a_02;
  uStack_268 = a_02->v[1];
  uStack_264 = a_02->v[2];
  uStack_260 = a_02->v[6];
  psStack_258 = b_00;
  iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar4 < 1) {
LAB_0014c096:
    pcStack_278 = (code *)0x14c09b;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014c09b:
    pcStack_278 = (code *)0x14c0a0;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014c0a0:
    pcStack_278 = (code *)0x14c0a5;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014c0a5:
    pcStack_278 = (code *)0x14c0aa;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_278 = (code *)0x14bded;
    psVar25 = a_02;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_258,1);
    if (-1 < iVar4) goto LAB_0014c09b;
    uVar29 = iStack_23c >> 0x1f;
    uStack_240 = psStack_258->v[1];
    uVar5 = (uVar29 & uStack_240) + uStack_268;
    uStack_268 = psStack_258->v[2];
    uVar17 = (uVar29 & uStack_268) + uStack_264;
    uStack_264 = psStack_258->v[3];
    uStack_244 = psStack_258->v[4];
    uStack_248 = psStack_258->v[5];
    uStack_24c = psStack_258->v[6];
    uVar40 = (uVar29 & uStack_24c) + uStack_260;
    uStack_260 = psStack_258->v[7];
    uStack_26c = (int)uStack_25c >> 0x1f;
    uStack_25c = psStack_258->v[8];
    uVar30 = ((uVar29 & psStack_258->v[0]) + uVar9 ^ uStack_26c) - uStack_26c;
    uVar21 = ((int)uVar30 >> 0x1e) + ((uVar5 ^ uStack_26c) - uStack_26c);
    uVar5 = ((int)uVar21 >> 0x1e) + ((uVar17 ^ uStack_26c) - uStack_26c);
    uVar41 = ((int)uVar5 >> 0x1e) + (((uVar29 & uStack_264) + uVar14 ^ uStack_26c) - uStack_26c);
    uVar14 = ((int)uVar41 >> 0x1e) + (((uVar29 & uStack_244) + uVar31 ^ uStack_26c) - uStack_26c);
    uVar9 = ((int)uVar14 >> 0x1e) + (((uVar29 & uStack_248) + uVar32 ^ uStack_26c) - uStack_26c);
    uVar31 = ((int)uVar9 >> 0x1e) + ((uVar40 ^ uStack_26c) - uStack_26c);
    uVar32 = ((int)uVar31 >> 0x1e) + (((uVar29 & uStack_260) + uVar13 ^ uStack_26c) - uStack_26c);
    uVar34 = ((int)uVar32 >> 0x1e) +
             (((uVar29 & uStack_25c) + iStack_23c ^ uStack_26c) - uStack_26c);
    uVar38 = (ulong)uVar34;
    uStack_270 = (int)uVar34 >> 0x1f;
    uVar40 = (psStack_258->v[0] & uStack_270) + (uVar30 & 0x3fffffff);
    uVar17 = (uStack_248 & uStack_270) + (uVar9 & 0x3fffffff);
    uVar27 = (ulong)uVar17;
    uVar30 = (uStack_24c & uStack_270) + (uVar31 & 0x3fffffff);
    uVar7 = (ulong)uVar30;
    uVar9 = ((int)uVar40 >> 0x1e) + (uStack_240 & uStack_270) + (uVar21 & 0x3fffffff);
    uVar31 = ((int)uVar9 >> 0x1e) + (uStack_268 & uStack_270) + (uVar5 & 0x3fffffff);
    uVar13 = ((int)uVar31 >> 0x1e) + (uStack_264 & uStack_270) + (uVar41 & 0x3fffffff);
    uVar29 = ((int)uVar13 >> 0x1e) + (uStack_244 & uStack_270) + (uVar14 & 0x3fffffff);
    uVar17 = ((int)uVar29 >> 0x1e) + uVar17;
    uVar30 = ((int)uVar17 >> 0x1e) + uVar30;
    uVar14 = ((int)uVar30 >> 0x1e) + (uStack_260 & uStack_270) + (uVar32 & 0x3fffffff);
    uVar32 = ((int)uVar14 >> 0x1e) + (uStack_25c & uStack_270) + uVar34;
    uVar11 = (ulong)uVar32;
    uVar13 = uVar13 & 0x3fffffff;
    psVar23 = (secp256k1_fe *)(ulong)uVar13;
    uVar29 = uVar29 & 0x3fffffff;
    psVar25 = (secp256k1_modinv32_signed30 *)(ulong)uVar29;
    uVar14 = uVar14 & 0x3fffffff;
    uVar42 = (ulong)uVar14;
    a_02->v[0] = uVar40 & 0x3fffffff;
    a_02->v[1] = uVar9 & 0x3fffffff;
    a_02->v[2] = uVar31 & 0x3fffffff;
    a_02->v[3] = uVar13;
    a_02->v[4] = uVar29;
    a_02->v[5] = uVar17 & 0x3fffffff;
    a_02->v[6] = uVar30 & 0x3fffffff;
    a_02->v[7] = uVar14;
    a_02->v[8] = uVar32;
    if (0x3fffffff < uVar32) goto LAB_0014c0a0;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_278 = (code *)0x14c05e;
    psVar25 = a_02;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_258,0);
    if (iVar4 < 0) goto LAB_0014c0a5;
    psVar23 = (secp256k1_fe *)0x9;
    pcStack_278 = (code *)0x14c079;
    psVar25 = a_02;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_258,1);
    if (iVar4 < 0) {
      return;
    }
  }
  pcStack_278 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_338;
  psVar20 = &sStack_338;
  pcVar37 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar37 = secp256k1_fe_inv;
  }
  pcStack_340 = (code *)0x14c0e0;
  uStack_2a0 = uVar42;
  uStack_298 = uVar38;
  uStack_290 = uVar7;
  psStack_288 = a_02;
  uStack_280 = uVar27;
  pcStack_278 = (code *)uVar11;
  (*pcVar37)(&sStack_338);
  if (psVar25 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar25->v + 8) = sStack_338.n[4];
    *(ulong *)(psVar25[1].v + 1) = CONCAT44(sStack_338.normalized,sStack_338.magnitude);
    *(uint64_t *)(psVar25->v + 4) = sStack_338.n[2];
    *(uint64_t *)(psVar25->v + 6) = sStack_338.n[3];
    *(uint64_t *)psVar25->v = sStack_338.n[0];
    *(uint64_t *)(psVar25->v + 2) = sStack_338.n[1];
  }
  uVar11 = 0xffffffffffff;
  sStack_2d8.n[0] = psVar23->n[0];
  sStack_2d8.n[1] = psVar23->n[1];
  sStack_2d8.n[2] = psVar23->n[2];
  sStack_2d8.n[3] = psVar23->n[3];
  sStack_2d8.n[4] = psVar23->n[4];
  sStack_2d8.magnitude = psVar23->magnitude;
  sStack_2d8.normalized = psVar23->normalized;
  psVar24 = &sStack_2d8;
  pcStack_340 = (code *)0x14c149;
  secp256k1_fe_verify(psVar24);
  uVar42 = (sStack_2d8.n[4] >> 0x30) * 0x1000003d1 + sStack_2d8.n[0];
  if (((uVar42 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar42 & 0xfffffffffffff) == 0)) {
    uVar38 = (uVar42 >> 0x34) + sStack_2d8.n[1];
    uVar7 = (uVar38 >> 0x34) + sStack_2d8.n[2];
    uVar27 = (uVar7 >> 0x34) + sStack_2d8.n[3];
    uVar28 = (uVar27 >> 0x34) + (sStack_2d8.n[4] & 0xffffffffffff);
    if ((((uVar38 | uVar42 | uVar7 | uVar27) & 0xfffffffffffff) != 0 || uVar28 != 0) &&
       (((uVar42 | 0x1000003d0) & uVar38 & uVar7 & uVar27 & (uVar28 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c1f0;
LAB_0014c5ba:
    pcStack_340 = (code *)0x14c5c5;
    secp256k1_fe_verify(&sStack_338);
    uVar11 = sStack_338.n[4] & 0xffffffffffff;
    uVar42 = (sStack_338.n[4] >> 0x30) * 0x1000003d1 + sStack_338.n[0];
    uVar38 = (uVar42 >> 0x34) + sStack_338.n[1];
    uVar7 = (uVar38 >> 0x34) + sStack_338.n[2];
    r = (secp256k1_fe *)((uVar7 >> 0x34) + sStack_338.n[3]);
    uVar27 = ((ulong)r >> 0x34) + uVar11;
    if ((((uVar38 | uVar42 | uVar7 | (ulong)r) & 0xfffffffffffff) == 0 && uVar27 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar27 ^ 0xf000000000000), psVar20 = &sStack_338,
       ((uVar42 ^ 0x1000003d0) & uVar38 & uVar7 & (ulong)r & (ulong)r_00) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_0014c1f0:
    pcStack_340 = (code *)0x14c203;
    psVar24 = psVar23;
    secp256k1_fe_mul(&sStack_2d8,psVar23,&sStack_338);
    pcStack_340 = (code *)0x14c20b;
    secp256k1_fe_verify(&sStack_2d8);
    r_00 = &fe_minus_one;
    pcStack_340 = (code *)0x14c217;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_2d8.magnitude < 0x20) {
      sStack_2d8.n[0] = sStack_2d8.n[0] + 0xffffefffffc2e;
      sStack_2d8.n[1] = sStack_2d8.n[1] + 0xfffffffffffff;
      sStack_2d8.n[2] = sStack_2d8.n[2] + 0xfffffffffffff;
      sStack_2d8.n[3] = sStack_2d8.n[3] + 0xfffffffffffff;
      sStack_2d8.n[4] = sStack_2d8.n[4] + 0xffffffffffff;
      sStack_2d8.normalized = 0;
      sStack_2d8.magnitude = sStack_2d8.magnitude + 1;
      pcStack_340 = (code *)0x14c269;
      secp256k1_fe_verify(&sStack_2d8);
      pcStack_340 = (code *)0x14c271;
      secp256k1_fe_verify(&sStack_2d8);
      uVar42 = (sStack_2d8.n[4] >> 0x30) * 0x1000003d1 + sStack_2d8.n[0];
      uVar38 = (uVar42 >> 0x34) + sStack_2d8.n[1];
      uVar7 = (uVar38 >> 0x34) + sStack_2d8.n[2];
      psVar24 = (secp256k1_fe *)((uVar7 >> 0x34) + sStack_2d8.n[3]);
      uVar27 = ((ulong)psVar24 >> 0x34) + (sStack_2d8.n[4] & 0xffffffffffff);
      if ((((uVar38 | uVar42 | uVar7 | (ulong)psVar24) & 0xfffffffffffff) != 0 || uVar27 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar27 ^ 0xf000000000000),
         ((uVar42 ^ 0x1000003d0) & uVar38 & uVar7 & (ulong)psVar24 & (ulong)r_00) != 0xfffffffffffff
         )) goto LAB_0014c658;
      sStack_308.n[0] = psVar23->n[0];
      sStack_308.n[1] = psVar23->n[1];
      sStack_308.n[2] = psVar23->n[2];
      sStack_308.n[3] = psVar23->n[3];
      sStack_308.n[4] = psVar23->n[4];
      sStack_308.magnitude = psVar23->magnitude;
      sStack_308.normalized = psVar23->normalized;
      psVar23 = &sStack_308;
      pcStack_340 = (code *)0x14c317;
      secp256k1_fe_verify(psVar23);
      r_00 = &fe_minus_one;
      pcStack_340 = (code *)0x14c323;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_308.magnitude) goto LAB_0014c65d;
      sStack_308.n[0] = sStack_308.n[0] + 0xffffefffffc2e;
      sStack_308.n[1] = sStack_308.n[1] + 0xfffffffffffff;
      sStack_308.n[2] = sStack_308.n[2] + 0xfffffffffffff;
      sStack_308.n[3] = sStack_308.n[3] + 0xfffffffffffff;
      sStack_308.n[4] = sStack_308.n[4] + 0xffffffffffff;
      sStack_308.normalized = 0;
      sStack_308.magnitude = sStack_308.magnitude + 1;
      pcStack_340 = (code *)0x14c36e;
      secp256k1_fe_verify(&sStack_308);
      pcStack_340 = (code *)0x14c376;
      secp256k1_fe_verify(&sStack_308);
      uVar42 = (sStack_308.n[4] >> 0x30) * 0x1000003d1 + sStack_308.n[0];
      if (((uVar42 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar42 & 0xfffffffffffff) == 0)) {
        uVar38 = (uVar42 >> 0x34) + sStack_308.n[1];
        uVar7 = (uVar38 >> 0x34) + sStack_308.n[2];
        uVar27 = (uVar7 >> 0x34) + sStack_308.n[3];
        uVar28 = (uVar27 >> 0x34) + (sStack_308.n[4] & 0xffffffffffff);
        if (((uVar38 | uVar42 | uVar7 | uVar27) & 0xfffffffffffff) == 0 && uVar28 == 0) {
          return;
        }
        if (((uVar42 | 0x1000003d0) & uVar38 & uVar7 & uVar27 & (uVar28 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar24 = &sStack_308;
      pcStack_340 = (code *)0x14c425;
      (*pcVar37)();
      pcStack_340 = (code *)0x14c430;
      secp256k1_fe_verify(&sStack_338);
      r_00 = &fe_minus_one;
      pcStack_340 = (code *)0x14c43c;
      secp256k1_fe_verify(&fe_minus_one);
      psVar23 = &sStack_338;
      if (0x1f < sStack_338.magnitude) goto LAB_0014c662;
      sStack_338.n[0] = sStack_338.n[0] + 0xffffefffffc2e;
      sStack_338.n[1] = sStack_338.n[1] + 0xfffffffffffff;
      sStack_338.n[2] = sStack_338.n[2] + 0xfffffffffffff;
      sStack_338.n[3] = sStack_338.n[3] + 0xfffffffffffff;
      sStack_338.n[4] = sStack_338.n[4] + 0xffffffffffff;
      sStack_338.magnitude = sStack_338.magnitude + 1;
      sStack_338.normalized = 0;
      pcStack_340 = (code *)0x14c485;
      secp256k1_fe_verify(&sStack_338);
      pcStack_340 = (code *)0x14c48e;
      (*pcVar37)(&sStack_338);
      pcStack_340 = (code *)0x14c496;
      secp256k1_fe_verify(&sStack_338);
      sStack_338.n[0] = sStack_338.n[0] + 1;
      sStack_338.magnitude = sStack_338.magnitude + 1;
      sStack_338.normalized = 0;
      pcStack_340 = (code *)0x14c4a8;
      secp256k1_fe_verify(&sStack_338);
      pcStack_340 = (code *)0x14c4b0;
      secp256k1_fe_verify(&sStack_338);
      psVar24 = &sStack_308;
      pcStack_340 = (code *)0x14c4bd;
      r_00 = psVar24;
      secp256k1_fe_verify(psVar24);
      if (sStack_308.magnitude + sStack_338.magnitude < 0x21) {
        sStack_338.n[0] = sStack_338.n[0] + sStack_308.n[0];
        sStack_338.n[1] = sStack_338.n[1] + sStack_308.n[1];
        sStack_338.n[2] = sStack_338.n[2] + sStack_308.n[2];
        sStack_338.n[3] = sStack_338.n[3] + sStack_308.n[3];
        sStack_338.n[4] = sStack_338.n[4] + sStack_308.n[4];
        sStack_338.normalized = 0;
        pcStack_340 = (code *)0x14c509;
        sStack_338.magnitude = sStack_308.magnitude + sStack_338.magnitude;
        secp256k1_fe_verify(&sStack_338);
        pcStack_340 = (code *)0x14c511;
        secp256k1_fe_verify(&sStack_338);
        uVar42 = (sStack_338.n[4] >> 0x30) * 0x1000003d1 + sStack_338.n[0];
        if (((uVar42 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar42 & 0xfffffffffffff) == 0)) {
          uVar11 = (uVar42 >> 0x34) + sStack_338.n[1];
          uVar38 = (uVar11 >> 0x34) + sStack_338.n[2];
          uVar7 = (uVar38 >> 0x34) + sStack_338.n[3];
          uVar27 = (uVar7 >> 0x34) + (sStack_338.n[4] & 0xffffffffffff);
          if (((uVar11 | uVar42 | uVar38 | uVar7) & 0xfffffffffffff) == 0 && uVar27 == 0) {
            return;
          }
          if (((uVar42 | 0x1000003d0) & uVar11 & uVar38 & uVar7 & (uVar27 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_340 = (code *)0x14c5ba;
        test_inverse_field_cold_2();
        goto LAB_0014c5ba;
      }
    }
    else {
      pcStack_340 = (code *)0x14c658;
      test_inverse_field_cold_7();
LAB_0014c658:
      pcStack_340 = (code *)0x14c65d;
      test_inverse_field_cold_6();
LAB_0014c65d:
      pcStack_340 = (code *)0x14c662;
      test_inverse_field_cold_5();
LAB_0014c662:
      r = psVar24;
      psVar20 = psVar23;
      psVar24 = &sStack_2d8;
      pcStack_340 = (code *)0x14c667;
      test_inverse_field_cold_4();
    }
    pcStack_340 = (code *)0x14c66c;
    test_inverse_field_cold_3();
  }
  pcStack_340 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_340 = (code *)0xfffffffffffff;
  psVar23 = (secp256k1_fe *)auStack_3b0;
  pcVar43 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar43 = secp256k1_scalar_inverse;
  }
  pcStack_3b8 = (code *)0x14c69a;
  auStack_370._32_8_ = psVar20;
  auStack_370._40_8_ = psVar24;
  (*pcVar43)(auStack_3b0);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_3b0._20_4_,auStack_3b0._16_4_);
    r_00->n[3] = CONCAT44(auStack_3b0._28_4_,auStack_3b0._24_4_);
    r_00->n[0] = CONCAT44(auStack_3b0._4_4_,auStack_3b0._0_4_);
    r_00->n[1] = CONCAT44(auStack_3b0._12_4_,auStack_3b0._8_4_);
  }
  pcStack_3b8 = (code *)0x14c6b9;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar45._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar45._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar45._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar45._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar4 = movmskps(extraout_EAX,auVar45);
  if (iVar4 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_370;
    pcStack_3b8 = (code *)0x14c6ed;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_3b0);
    pcStack_3b8 = (code *)0x14c6f5;
    psVar20 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_370._0_8_ != 1 || auStack_370._8_8_ != 0) || auStack_370._16_8_ != 0) ||
        auStack_370._24_8_ != 0) {
      pcStack_3b8 = (code *)0x14c7ff;
      test_inverse_scalar_cold_1();
      goto LAB_0014c7ff;
    }
    pcStack_3b8 = (code *)0x14c725;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_3b0 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_3b8 = (code *)0x14c72d;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_3b0 + 0x20));
    auVar46._0_4_ = -(uint)(iStack_380 == 0 && auStack_3b0._32_4_ == 0);
    auVar46._4_4_ = -(uint)(iStack_37c == 0 && iStack_38c == 0);
    auVar46._8_4_ = -(uint)(iStack_378 == 0 && iStack_388 == 0);
    auVar46._12_4_ = -(uint)(iStack_374 == 0 && iStack_384 == 0);
    iVar4 = movmskps(extraout_EAX_00,auVar46);
    if (iVar4 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_3b0 + 0x20);
    pcStack_3b8 = (code *)0x14c75e;
    (*pcVar43)(a,a);
    pcStack_3b8 = (code *)0x14c773;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_3b0,&scalar_minus_one,(secp256k1_scalar *)auStack_3b0);
    pcStack_3b8 = (code *)0x14c77c;
    (*pcVar43)(auStack_3b0,auStack_3b0);
    pcStack_3b8 = (code *)0x14c78e;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_3b0,(secp256k1_scalar *)auStack_3b0,&secp256k1_scalar_one
              );
    pcStack_3b8 = (code *)0x14c79c;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_3b0,a,(secp256k1_scalar *)auStack_3b0);
    pcStack_3b8 = (code *)0x14c7a4;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_3b0);
    auVar47._0_4_ = -(uint)(auStack_3b0._16_4_ == 0 && auStack_3b0._0_4_ == 0);
    auVar47._4_4_ = -(uint)(auStack_3b0._20_4_ == 0 && auStack_3b0._4_4_ == 0);
    auVar47._8_4_ = -(uint)(auStack_3b0._24_4_ == 0 && auStack_3b0._8_4_ == 0);
    auVar47._12_4_ = -(uint)(auStack_3b0._28_4_ == 0 && auStack_3b0._12_4_ == 0);
    iVar4 = movmskps(extraout_EAX_01,auVar47);
    if (iVar4 == 0xf) {
      return;
    }
    pcStack_3b8 = (code *)0x14c7c8;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_3b0;
  }
  pcStack_3b8 = (code *)0x14c7d3;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_3b0);
  auVar48._0_4_ = -(uint)(auStack_3b0._16_4_ == 0 && auStack_3b0._0_4_ == 0);
  auVar48._4_4_ = -(uint)(auStack_3b0._20_4_ == 0 && auStack_3b0._4_4_ == 0);
  auVar48._8_4_ = -(uint)(auStack_3b0._24_4_ == 0 && auStack_3b0._8_4_ == 0);
  auVar48._12_4_ = -(uint)(auStack_3b0._28_4_ == 0 && auStack_3b0._12_4_ == 0);
  iVar4 = movmskps(extraout_EAX_02,auVar48);
  r = (secp256k1_fe *)auStack_3b0;
  psVar20 = psVar23;
  if (iVar4 == 0xf) {
    return;
  }
LAB_0014c7ff:
  pcStack_3b8 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_3d0 = 0x1000003d1;
  __s = auStack_1468;
  psStack_3e0 = r;
  pcStack_3d8 = pcVar37;
  psStack_3c8 = r_00;
  pcStack_3c0 = pcVar43;
  pcStack_3b8 = (code *)uVar11;
  memset(__s,0,0x1081);
  uStack_1478 = 0;
  lVar8 = 0x41;
  psStack_1470 = psVar20;
  secp256k1_hsort(__s,0x41,(size_t)psVar20,test_hsort_cmp,&uStack_1478);
  if (0x3f < uStack_1478) {
    test_hsort_is_sorted(auStack_1468,0x41,(size_t)psVar20);
    if (0 < COUNT) {
      iVar4 = 0;
      do {
        uVar6 = testrand_int(0x41);
        count = (size_t)(int)uVar6;
        testrand_bytes_test(auStack_1468,count * (long)psVar20);
        secp256k1_hsort(auStack_1468,count,(size_t)psVar20,test_hsort_cmp,&uStack_1478);
        test_hsort_is_sorted(auStack_1468,count,(size_t)psVar20);
        iVar4 = iVar4 + 1;
      } while (iVar4 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar12 = 0;
    do {
      if (__s[lVar12] != *(uchar *)(lVar8 + lVar12)) {
        return;
      }
      lVar12 = lVar12 + 1;
    } while (extraout_RDX_01[1] != lVar12);
  }
  return;
}

Assistant:

static void secp256k1_modinv32(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv32_signed30 d = {{0}};
    secp256k1_modinv32_signed30 e = {{1}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int i;
    int32_t zeta = -1; /* zeta = -(delta+1/2); delta is initially 1/2. */

    /* Do 20 iterations of 30 divsteps each = 600 divsteps. 590 suffices for 256-bit inputs. */
    for (i = 0; i < 20; ++i) {
        /* Compute transition matrix and new zeta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        zeta = secp256k1_modinv32_divsteps_30(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  (secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) == 0)));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[8], modinfo);
    *x = d;
}